

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_common.cpp
# Opt level: O2

int myutils::SharedSemaphore::open(char *__file,int __oflag,...)

{
  SharedSemaphore *this;
  sem_t *psVar1;
  
  this = (SharedSemaphore *)operator_new(0x28);
  SharedSemaphore(this);
  psVar1 = sem_open(__file,0);
  this->m_sem = (sem_t *)psVar1;
  if (psVar1 == (sem_t *)0x0) {
    ~SharedSemaphore(this);
    operator_delete(this);
    this = (SharedSemaphore *)0x0;
  }
  return (int)this;
}

Assistant:

SharedSemaphore* SharedSemaphore::open(const char* name)
{
#ifdef _WIN32    
    HANDLE h = OpenSemaphoreA(SEMAPHORE_ALL_ACCESS, FALSE, name);
    if (h != nullptr) {
        auto sem = new SharedSemaphore();
        sem->m_hSemaphore = h;
        return sem;
    } else {
        return nullptr;
    }
#elif defined(__linux__)
    auto sem = new SharedSemaphore();
    sem->m_sem = sem_open(name, 0);
    if (sem->m_sem != SEM_FAILED) {
        return sem;
    } else {
        delete sem;
        return nullptr;
    }
#else
    auto sem = new SharedSemaphore();
    sem->m_data = (PthreadData*)name;
    return sem;
#endif
}